

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Debugging is OFF");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Test #, Message, Total Time in msec, # of objects, team per object, objects per second"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  start_timing();
  Am_Initialize();
  Am_Update_All();
  end_timing("Initialize",0);
  time_object_creation();
  time_data_structures();
  Am_Update_All();
  start_timing();
  Am_Cleanup();
  end_timing("Cleanup",0);
  print_summary();
  return 0;
}

Assistant:

int
main()
{
#if defined DEBUG | defined _DEBUG
  std::cout << "Debugging is ON" << std::endl;
#else
  std::cout << "Debugging is OFF" << std::endl;
#endif

  std::cout << "Test #, Message, Total Time in msec, # of objects, team per "
               "object, objects per second"
            << std::endl;

  start_timing();
  Am_Initialize();
  Am_Update_All();
  end_timing("Initialize", 0);

  time_object_creation();

  time_data_structures();

  Am_Update_All();
  start_timing();
  Am_Cleanup();
  end_timing("Cleanup", 0);
  print_summary();

  return 0;
}